

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O1

int VP8LHuffmanTablesAllocate(int size,HuffmanTables *huffman_tables)

{
  HuffmanCode *pHVar1;
  
  huffman_tables->curr_segment = &huffman_tables->root;
  (huffman_tables->root).next = (HuffmanTablesSegment *)0x0;
  pHVar1 = (HuffmanCode *)WebPSafeMalloc((long)size,4);
  (huffman_tables->root).start = pHVar1;
  if (pHVar1 != (HuffmanCode *)0x0) {
    (huffman_tables->root).curr_table = pHVar1;
    (huffman_tables->root).size = size;
  }
  return (uint)(pHVar1 != (HuffmanCode *)0x0);
}

Assistant:

int VP8LHuffmanTablesAllocate(int size, HuffmanTables* huffman_tables) {
  // Have 'segment' point to the first segment for now, 'root'.
  HuffmanTablesSegment* const root = &huffman_tables->root;
  huffman_tables->curr_segment = root;
  root->next = NULL;
  // Allocate root.
  root->start = (HuffmanCode*)WebPSafeMalloc(size, sizeof(*root->start));
  if (root->start == NULL) return 0;
  root->curr_table = root->start;
  root->size = size;
  return 1;
}